

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O1

void duckdb_brotli::BrotliStoreUncompressedMetaBlock
               (int is_final_block,uint8_t *input,size_t position,size_t mask,size_t len,
               size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t __n;
  
  uVar2 = position & mask;
  uVar1 = *storage_ix;
  *(ulong *)(storage + (uVar1 >> 3)) = (ulong)storage[uVar1 >> 3];
  uVar6 = uVar1 + 1;
  *storage_ix = uVar6;
  uVar3 = (int)len - 1;
  uVar4 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = (uVar4 ^ 0xffffffe0) + 0x21;
  if (len == 1) {
    uVar4 = 1;
  }
  uVar5 = 4;
  if (0xf < uVar4) {
    uVar5 = (ulong)(uVar4 + 3 >> 2);
  }
  *(ulong *)(storage + (uVar6 >> 3)) = uVar5 - 4 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
  uVar6 = uVar1 + 3;
  *storage_ix = uVar6;
  *(size_t *)(storage + (uVar6 >> 3)) = len - 1 << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
  uVar6 = uVar1 + uVar5 * 4 + 3;
  *storage_ix = uVar6;
  *(ulong *)(storage + (uVar6 >> 3)) = (ulong)storage[uVar6 >> 3] | 1L << ((byte)uVar6 & 7);
  uVar4 = (int)uVar6 + 8;
  uVar6 = (ulong)(uVar4 & 0xfffffff8);
  *storage_ix = uVar6;
  uVar4 = uVar4 >> 3;
  storage[uVar4] = '\0';
  if (mask + 1 < uVar2 + len) {
    __n = (mask + 1) - uVar2;
    switchD_00b1422a::default(storage + uVar4,input + uVar2,__n);
    *storage_ix = __n * 8 + uVar6;
    len = len - __n;
    uVar2 = 0;
  }
  uVar1 = *storage_ix;
  switchD_00b1422a::default(storage + (uVar1 >> 3),input + uVar2,len);
  uVar6 = uVar1 + len * 8;
  *storage_ix = uVar6;
  storage[uVar6 >> 3] = '\0';
  if (is_final_block != 0) {
    *(long *)(storage + (uVar6 >> 3)) = 1L << ((byte)uVar1 & 7);
    uVar1 = uVar6 + 1;
    *storage_ix = uVar1;
    *(ulong *)(storage + (uVar1 >> 3)) = (ulong)storage[uVar1 >> 3] | 1L << ((byte)uVar1 & 7);
    uVar4 = (int)uVar6 + 9;
    *storage_ix = (ulong)(uVar4 & 0xfffffff8);
    storage[uVar4 >> 3] = '\0';
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliStoreUncompressedMetaBlock(BROTLI_BOOL is_final_block,
                                      const uint8_t* BROTLI_RESTRICT input,
                                      size_t position, size_t mask,
                                      size_t len,
                                      size_t* BROTLI_RESTRICT storage_ix,
                                      uint8_t* BROTLI_RESTRICT storage) {
  size_t masked_pos = position & mask;
  BrotliStoreUncompressedMetaBlockHeader(len, storage_ix, storage);
  JumpToByteBoundary(storage_ix, storage);

  if (masked_pos + len > mask + 1) {
    size_t len1 = mask + 1 - masked_pos;
    memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len1);
    *storage_ix += len1 << 3;
    len -= len1;
    masked_pos = 0;
  }
  memcpy(&storage[*storage_ix >> 3], &input[masked_pos], len);
  *storage_ix += len << 3;

  /* We need to clear the next 4 bytes to continue to be
     compatible with BrotliWriteBits. */
  BrotliWriteBitsPrepareStorage(*storage_ix, storage);

  /* Since the uncompressed block itself may not be the final block, add an
     empty one after this. */
  if (is_final_block) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    JumpToByteBoundary(storage_ix, storage);
  }
}